

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3362:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3362:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  PromiseNode *pPVar1;
  ArrayDisposer *pAVar2;
  size_t sVar3;
  undefined8 uVar4;
  long *plVar5;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar6;
  ExceptionOr<kj::Own<kj::NetworkAddress>_> depResult;
  Disposer *local_620;
  PromiseNode *pPStack_618;
  Context *local_610;
  Disposer *local_608;
  ArrayDisposer *local_600;
  size_t local_5f8;
  char *local_5f0;
  ArrayDisposer *local_5e8;
  size_t local_5e0;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *local_5d8;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> local_5d0;
  ExceptionOrValue local_458;
  char *local_2f8;
  long *plStack_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_458.exception.ptr.isSet = false;
  local_2f8 = (char *)0x0;
  plStack_2f0 = (long *)0x0;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_458);
  plVar5 = plStack_2f0;
  uVar4 = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_458.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_458.exception.ptr.field_1 + 0x50);
    local_5e0 = local_458.exception.ptr.field_1.value.ownFile.content.size_;
    local_2e8.ownFile.content.ptr = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
    local_2e8.ownFile.content.size_ = local_458.exception.ptr.field_1.value.ownFile.content.size_;
    local_5e8 = local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_458.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_458.exception.ptr.field_1.value.file;
    local_2e8.line = local_458.exception.ptr.field_1.value.line;
    local_2e8.type = local_458.exception.ptr.field_1.value.type;
    local_5f0 = local_458.exception.ptr.field_1.value.description.content.ptr;
    local_2e8.description.content.ptr =
         local_458.exception.ptr.field_1.value.description.content.ptr;
    local_5f8 = local_458.exception.ptr.field_1.value.description.content.size_;
    local_2e8.description.content.size_ =
         local_458.exception.ptr.field_1.value.description.content.size_;
    local_600 = local_458.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_458.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.description.content.size_ = 0;
    local_608 = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.disposer = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_610 = local_458.exception.ptr.field_1.value.context.ptr.ptr;
    local_2e8.context.ptr.ptr = local_458.exception.ptr.field_1.value.context.ptr.ptr;
    local_458.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_5d8 = (ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *)output;
    memcpy(local_2e8.trace,__src,0x104);
    sVar3 = local_5e0;
    pAVar2 = local_5e8;
    local_188.ownFile.content.ptr = (char *)uVar4;
    local_188.ownFile.content.size_ = local_5e0;
    local_188.ownFile.content.disposer = local_5e8;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_188.file = local_458.exception.ptr.field_1.value.file;
    local_188.line = local_458.exception.ptr.field_1.value.line;
    local_188.type = local_458.exception.ptr.field_1.value.type;
    local_188.description.content.ptr = local_5f0;
    local_188.description.content.size_ = local_5f8;
    local_188.description.content.disposer = local_600;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_608;
    local_188.context.ptr.ptr = local_610;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar4
    ;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = sVar3;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer = pAVar2;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_458.exception.ptr.field_1.value.file;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_458.exception.ptr.field_1._32_8_;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr = local_5f0
    ;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_5f8;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_600;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer = local_608;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = local_610;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5d0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5d0.value.ptr.isSet = false;
    Exception::~Exception(&local_188);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=(local_5d8,&local_5d0);
    uVar4 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar4)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar4)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_2e8);
  }
  else if (plStack_2f0 != (long *)0x0) {
    local_2e8.ownFile.content.ptr = local_2f8;
    local_2e8.ownFile.content.size_ = (size_t)plStack_2f0;
    plStack_2f0 = (long *)0x0;
    (**(code **)*plVar5)(&local_188);
    PVar6 = Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::NetworkAddress>>
                      ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_620,
                       (Own<kj::NetworkAddress> *)&local_188);
    sVar3 = local_188.ownFile.content.size_;
    if ((long *)local_188.ownFile.content.size_ != (long *)0x0) {
      local_188.ownFile.content.size_ = 0;
      (*(code *)**(undefined8 **)local_188.ownFile.content.ptr)
                (local_188.ownFile.content.ptr,sVar3 + *(long *)(*(long *)sVar3 + -0x10),
                 PVar6.super_PromiseBase.node.ptr);
    }
    sVar3 = local_2e8.ownFile.content.size_;
    if ((long *)local_2e8.ownFile.content.size_ != (long *)0x0) {
      local_2e8.ownFile.content.size_ = 0;
      (*(code *)**(undefined8 **)local_2e8.ownFile.content.ptr)
                (local_2e8.ownFile.content.ptr,sVar3 + *(long *)(*(long *)sVar3 + -0x10));
    }
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d0.value.ptr.isSet = true;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer = local_620;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = pPStack_618;
    pPStack_618 = (PromiseNode *)0x0;
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *)output,&local_5d0);
    uVar4 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar4)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar4)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    pPVar1 = pPStack_618;
    if (pPStack_618 != (PromiseNode *)0x0) {
      pPStack_618 = (PromiseNode *)0x0;
      (**local_620->_vptr_Disposer)
                (local_620,
                 (_func_int *)
                 ((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2]));
    }
  }
  plVar5 = plStack_2f0;
  if (plStack_2f0 != (long *)0x0) {
    plStack_2f0 = (long *)0x0;
    (*(code *)**(undefined8 **)local_2f8)(local_2f8,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  if (local_458.exception.ptr.isSet == true) {
    Exception::~Exception(&local_458.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }